

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

void __thiscall irr::gui::CGUITabControl::~CGUITabControl(CGUITabControl *this)

{
  ~CGUITabControl((CGUITabControl *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)));
  return;
}

Assistant:

CGUITabControl::~CGUITabControl()
{
	for (u32 i = 0; i < Tabs.size(); ++i) {
		if (Tabs[i])
			Tabs[i]->drop();
	}

	if (UpButton)
		UpButton->drop();

	if (DownButton)
		DownButton->drop();
}